

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_pre_g_table(secp256k1_ge_storage *pre_g,size_t n)

{
  int *piVar1;
  uint64_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  byte bVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  int iVar124;
  uint uVar125;
  int iVar126;
  ulong uVar127;
  ulong uVar128;
  ulong uVar129;
  ulong uVar130;
  ulong uVar131;
  ulong uVar132;
  ulong uVar133;
  ulong uVar134;
  ulong uVar135;
  long lVar136;
  uint extraout_EDX;
  ulong uVar137;
  ulong uVar138;
  uint uVar139;
  uint uVar140;
  secp256k1_ge_storage *a;
  secp256k1_ge *psVar141;
  secp256k1_ge *psVar142;
  ulong uVar143;
  ulong uVar144;
  uint uVar145;
  ulong uVar146;
  ulong uVar147;
  ulong uVar148;
  ulong uVar149;
  ulong uVar150;
  ulong uVar151;
  ulong uVar152;
  uint uVar153;
  ulong uVar154;
  byte bVar155;
  secp256k1_fe dqy;
  secp256k1_ge p;
  secp256k1_gej g2;
  secp256k1_ge q;
  secp256k1_ge gg;
  long local_300;
  secp256k1_ge local_2e0;
  uint64_t local_288;
  uint64_t local_280;
  uint64_t local_278;
  uint64_t local_270;
  undefined1 local_268 [48];
  ulong local_238;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  secp256k1_fe local_218;
  secp256k1_ge_storage *local_1f0;
  undefined8 local_1e8;
  secp256k1_ge local_1e0;
  secp256k1_gej local_188;
  secp256k1_fe local_108;
  secp256k1_ge local_e0;
  secp256k1_ge local_88;
  
  bVar155 = 0;
  psVar141 = &local_1e0;
  local_1f0 = pre_g;
  secp256k1_ge_from_storage(psVar141,pre_g);
  iVar124 = secp256k1_ge_is_valid_var(psVar141);
  if (iVar124 != 0) {
    local_188.infinity = local_1e0.infinity;
    local_188.x.n[0] = local_1e0.x.n[0];
    local_188.x.n[1] = local_1e0.x.n[1];
    local_188.x.n[2] = local_1e0.x.n[2];
    local_188.x.n[3] = local_1e0.x.n[3];
    local_188.x.n[4] = local_1e0.x.n[4];
    local_188.y.n[0] = local_1e0.y.n[0];
    local_188.y.n[1] = local_1e0.y.n[1];
    local_188.y.n[2] = local_1e0.y.n[2];
    local_188.y.n[3] = local_1e0.y.n[3];
    local_188.y.n[4] = local_1e0.y.n[4];
    local_188.z.n[0] = 1;
    local_188.z.n[1] = 0;
    local_188.z.n[2] = 0;
    local_188.z.n[3] = 0;
    local_188.z.n[4] = 0;
    if (local_1e0.infinity == 0) {
      secp256k1_gej_double(&local_188,&local_188);
    }
    else {
      local_188.infinity = 1;
      local_188.x.n[0] = 0;
      local_188.x.n[1] = 0;
      local_188.x.n[2] = 0;
      local_188.x.n[3] = 0;
      local_188.x.n[4] = 0;
      local_188.y.n[0] = 0;
      local_188.y.n[1] = 0;
      local_188.y.n[2] = 0;
      local_188.y.n[3] = 0;
      local_188.y.n[4] = 0;
      local_188.z.n[0] = 0;
      local_188.z.n[1] = 0;
      local_188.z.n[2] = 0;
      local_188.z.n[3] = 0;
      local_188.z.n[4] = 0;
    }
    secp256k1_ge_set_gej_var(&local_88,&local_188);
    local_270 = local_88.x.n[0];
    local_278 = local_88.x.n[1];
    local_280 = local_88.x.n[2];
    local_288 = local_88.x.n[3];
    local_2e0._80_8_ = local_88.x.n[4];
    local_2e0.y.n[4] = local_88.y.n[0];
    local_2e0.y.n[3] = local_88.y.n[1];
    local_2e0.y.n[2] = local_88.y.n[2];
    local_2e0.y.n[1] = local_88.y.n[3];
    local_300 = 0x40;
    local_2e0.y.n[0] = local_88.y.n[4];
    while( true ) {
      uVar127 = (local_2e0._80_8_ - local_1e0.x.n[4]) + 0x3fffffffffffc;
      uVar146 = (uVar127 >> 0x30) * 0x1000003d1 + (local_270 - local_1e0.x.n[0]) + 0x3ffffbfffff0bc;
      uVar151 = (uVar146 >> 0x34) + (local_278 - local_1e0.x.n[1]) + 0x3ffffffffffffc;
      uVar148 = (uVar151 >> 0x34) + (local_280 - local_1e0.x.n[2]) + 0x3ffffffffffffc;
      uVar143 = (uVar148 >> 0x34) + (local_288 - local_1e0.x.n[3]) + 0x3ffffffffffffc;
      uVar144 = (uVar143 >> 0x34) + (uVar127 & 0xffffffffffff);
      a = (secp256k1_ge_storage *)((local_2e0.y.n[3] - local_1e0.y.n[1]) + 0x3ffffffffffffc);
      uVar127 = (local_2e0.y.n[0] - local_1e0.y.n[4]) + 0x3fffffffffffc;
      uVar150 = (uVar127 >> 0x30) * 0x1000003d1 +
                (local_2e0.y.n[4] - local_1e0.y.n[0]) + 0x3ffffbfffff0bc;
      uVar149 = (long)(a->x).n + (uVar150 >> 0x34);
      uVar137 = (uVar149 >> 0x34) + (local_2e0.y.n[2] - local_1e0.y.n[2]) + 0x3ffffffffffffc;
      uVar154 = (uVar137 >> 0x34) + (local_2e0.y.n[1] - local_1e0.y.n[3]) + 0x3ffffffffffffc;
      uVar127 = (uVar154 >> 0x34) + (uVar127 & 0xffffffffffff);
      uVar146 = uVar146 & 0xfffffffffffff;
      uVar151 = uVar151 & 0xfffffffffffff;
      uVar148 = uVar148 & 0xfffffffffffff;
      uVar143 = uVar143 & 0xfffffffffffff;
      uVar150 = uVar150 & 0xfffffffffffff;
      uVar149 = uVar149 & 0xfffffffffffff;
      uVar137 = uVar137 & 0xfffffffffffff;
      uVar154 = uVar154 & 0xfffffffffffff;
      local_268._40_8_ = uVar150;
      local_238 = uVar149;
      local_230 = uVar137;
      local_228 = uVar154;
      local_220 = uVar127;
      local_218.n[0] = uVar146;
      local_218.n[1] = uVar151;
      local_218.n[2] = uVar148;
      local_218.n[3] = uVar143;
      local_218.n[4] = uVar144;
      iVar124 = secp256k1_fe_impl_normalizes_to_zero_var(&local_218);
      if (iVar124 != 0) break;
LAB_001681d9:
      a = (secp256k1_ge_storage *)((long)(local_1f0->x).n + local_300);
      psVar141 = &local_e0;
      secp256k1_ge_from_storage(psVar141,a);
      iVar124 = secp256k1_ge_is_valid_var(psVar141);
      if (iVar124 == 0) {
        test_pre_g_table_cold_5();
LAB_00168dde:
        test_pre_g_table_cold_4();
        goto LAB_00168de3;
      }
      uVar138 = (local_270 - local_e0.x.n[0]) + 0x3ffffbfffff0bc;
      uVar128 = (local_278 - local_e0.x.n[1]) + 0x3ffffffffffffc;
      uVar129 = (local_280 - local_e0.x.n[2]) + 0x3ffffffffffffc;
      uVar130 = (local_288 - local_e0.x.n[3]) + 0x3ffffffffffffc;
      uVar135 = (local_2e0._80_8_ - local_e0.x.n[4]) + 0x3fffffffffffc;
      uVar131 = local_e0.y.n[0] + local_2e0.y.n[4];
      pre_g = (secp256k1_ge_storage *)(local_e0.y.n[1] + local_2e0.y.n[3]);
      uVar132 = local_e0.y.n[2] + local_2e0.y.n[2];
      uVar152 = local_e0.y.n[3] + local_2e0.y.n[1];
      uVar133 = local_e0.y.n[4] + local_2e0.y.n[0];
      local_268._0_8_ = uVar131;
      local_268._8_8_ = pre_g;
      local_268._16_8_ = uVar132;
      local_268._24_8_ = uVar152;
      local_268._32_8_ = uVar133;
      local_108.n[0] = uVar138;
      local_108.n[1] = uVar128;
      local_108.n[2] = uVar129;
      local_108.n[3] = uVar130;
      local_108.n[4] = uVar135;
      iVar124 = secp256k1_fe_impl_normalizes_to_zero_var(&local_108);
      if (iVar124 != 0) {
        psVar141 = (secp256k1_ge *)local_268;
        iVar124 = secp256k1_fe_impl_normalizes_to_zero_var((secp256k1_fe *)psVar141);
        if (iVar124 == 0) goto LAB_001683b1;
        goto LAB_00168de8;
      }
LAB_001683b1:
      local_2e0.x.n[0] = (uVar138 - uVar146) + 0x3ffffbfffff0bc;
      local_2e0.x.n[1] = (uVar128 - uVar151) + 0x3ffffffffffffc;
      local_2e0.x.n[2] = (uVar129 - uVar148) + 0x3ffffffffffffc;
      local_2e0.x.n[3] = (uVar130 - uVar143) + 0x3ffffffffffffc;
      local_2e0.x.n[4] = (uVar135 - uVar144) + 0x3fffffffffffc;
      psVar141 = &local_2e0;
      iVar124 = secp256k1_fe_impl_normalizes_to_zero(&psVar141->x);
      if (iVar124 != 0) {
        local_2e0.x.n[0] = (uVar131 - uVar150) + 0x3ffffbfffff0bc;
        local_2e0.x.n[1] = (long)pre_g + (0x3ffffffffffffc - uVar149);
        local_2e0.x.n[2] = (uVar132 - uVar137) + 0x3ffffffffffffc;
        local_2e0.x.n[3] = (uVar152 - uVar154) + 0x3ffffffffffffc;
        local_2e0.x.n[4] = (uVar133 - uVar127) + 0x3fffffffffffc;
        iVar124 = secp256k1_fe_impl_normalizes_to_zero(&psVar141->x);
        if (iVar124 == 0) goto LAB_00168524;
        goto LAB_00168ded;
      }
LAB_00168524:
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar152;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar146;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar132;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar151;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = pre_g;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar148;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar131;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar143;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar133;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = uVar144;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = SUB168(auVar7 * auVar69,0);
      auVar3 = auVar8 * ZEXT816(0x1000003d10) +
               auVar3 * auVar65 + auVar4 * auVar66 + auVar6 * auVar68 + auVar5 * auVar67;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar133;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar146;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar152;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar151;
      local_1e8 = SUB168(auVar10 * auVar71,8);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar132;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = uVar148;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = pre_g;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = uVar143;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar131;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar144;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = SUB168(auVar7 * auVar69,8);
      auVar4 = auVar14 * ZEXT816(0x1000003d10000) +
               auVar9 * auVar70 +
               auVar10 * auVar71 + auVar11 * auVar72 + auVar13 * auVar74 + auVar12 * auVar73 +
               (auVar3 >> 0x34);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar131;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar146;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar133;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = uVar151;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar152;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar148;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar132;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar143;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = pre_g;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = uVar144;
      auVar5 = auVar19 * auVar79 + auVar18 * auVar78 + auVar17 * auVar77 + auVar16 * auVar76 +
               (auVar4 >> 0x34);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = (auVar5._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar4._6_2_ & 0xf);
      auVar6 = auVar15 * auVar75 + auVar20 * ZEXT816(0x1000003d1);
      uVar134 = auVar6._0_8_;
      uVar147 = auVar6._8_8_;
      local_218.n[0] = uVar134 & 0xfffffffffffff;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = pre_g;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar146;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar131;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar151;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar133;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar148;
      auVar116._8_8_ = uVar147 >> 0x34;
      auVar116._0_8_ = uVar147 * 0x1000 | uVar134 >> 0x34;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar152;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar143;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar132;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar144;
      auVar5 = auVar23 * auVar82 + auVar25 * auVar84 + auVar24 * auVar83 + (auVar5 >> 0x34);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
      auVar116 = auVar26 * ZEXT816(0x1000003d10) + auVar21 * auVar80 + auVar22 * auVar81 + auVar116;
      local_218.n[1] = auVar116._0_8_ & 0xfffffffffffff;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar132;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = uVar146;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = pre_g;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar151;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar131;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar148;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar133;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar143;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar152;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar144;
      auVar5 = auVar31 * auVar89 + auVar30 * auVar88 + (auVar5 >> 0x34);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = auVar5._0_8_;
      auVar6 = auVar32 * ZEXT816(0x1000003d10) +
               auVar28 * auVar86 + auVar29 * auVar87 + auVar27 * auVar85 + (auVar116 >> 0x34);
      auVar7 = auVar6 >> 0x34;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = auVar7._0_8_;
      local_218.n[2] = auVar6._0_8_ & 0xfffffffffffff;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = auVar5._8_8_;
      auVar119._8_8_ = auVar7._8_8_;
      auVar119._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar120 = auVar33 * ZEXT816(0x1000003d10000) + auVar119 + auVar120;
      local_218.n[3] = auVar120._0_8_;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar130;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar150;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar129;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar149;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar128;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar137;
      local_218.n[4] =
           (auVar120._8_8_ << 0xc | local_218.n[3] >> 0x34) + (auVar4._0_8_ & 0xffffffffffff);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar138;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar154;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar135;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar127;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = SUB168(auVar38 * auVar94,0);
      local_218.n[3] = local_218.n[3] & 0xfffffffffffff;
      auVar3 = auVar39 * ZEXT816(0x1000003d10) +
               auVar35 * auVar91 + auVar37 * auVar93 + auVar36 * auVar92 + auVar34 * auVar90;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar135;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar150;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar130;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar149;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar129;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = uVar137;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar128;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar154;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar138;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = uVar127;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = SUB168(auVar38 * auVar94,8);
      auVar4 = auVar45 * ZEXT816(0x1000003d10000) +
               auVar41 * auVar96 + auVar42 * auVar97 + auVar44 * auVar99 + auVar43 * auVar98 +
               auVar40 * auVar95 + (auVar3 >> 0x34);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar138;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = uVar150;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar135;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uVar149;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar130;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = uVar137;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar129;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = uVar154;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar128;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = uVar127;
      auVar5 = (auVar4 >> 0x34) +
               auVar50 * auVar104 + auVar49 * auVar103 + auVar48 * auVar102 + auVar47 * auVar101;
      uVar143 = auVar5._0_8_;
      uVar144 = auVar5._8_8_;
      auVar123._8_8_ = uVar144 >> 0x34;
      auVar123._0_8_ = uVar144 * 0x1000 | uVar143 >> 0x34;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar143 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar4._6_2_ & 0xf);
      auVar5 = auVar51 * ZEXT816(0x1000003d1) + auVar46 * auVar100;
      uVar144 = auVar5._0_8_;
      uVar143 = auVar5._8_8_;
      local_268._40_8_ = uVar144 & 0xfffffffffffff;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar128;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = uVar150;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar138;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = uVar149;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar135;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = uVar137;
      auVar117._8_8_ = uVar143 >> 0x34;
      auVar117._0_8_ = uVar143 * 0x1000 | uVar144 >> 0x34;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar130;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = uVar154;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar129;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = uVar127;
      auVar123 = auVar54 * auVar107 + auVar56 * auVar109 + auVar55 * auVar108 + auVar123;
      uVar144 = auVar123._0_8_;
      uVar143 = auVar123._8_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar144 & 0xfffffffffffff;
      auVar117 = auVar57 * ZEXT816(0x1000003d10) + auVar53 * auVar106 + auVar52 * auVar105 +
                 auVar117;
      auVar118._8_8_ = uVar143 >> 0x34;
      auVar118._0_8_ = uVar143 * 0x1000 | uVar144 >> 0x34;
      local_238 = auVar117._0_8_ & 0xfffffffffffff;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar129;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = uVar150;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar128;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uVar149;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar138;
      auVar112._8_8_ = 0;
      auVar112._0_8_ = uVar137;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar135;
      auVar113._8_8_ = 0;
      auVar113._0_8_ = uVar154;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar130;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = uVar127;
      auVar118 = auVar62 * auVar114 + auVar61 * auVar113 + auVar118;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = auVar118._0_8_;
      auVar5 = auVar63 * ZEXT816(0x1000003d10) +
               auVar58 * auVar110 + auVar59 * auVar111 + auVar60 * auVar112 + (auVar117 >> 0x34);
      auVar6 = auVar5 >> 0x34;
      auVar122._8_8_ = 0;
      auVar122._0_8_ = auVar6._0_8_;
      local_230 = auVar5._0_8_ & 0xfffffffffffff;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = auVar118._8_8_;
      a = auVar6._8_8_;
      auVar121._8_8_ = a;
      auVar121._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar122 = auVar64 * ZEXT816(0x1000003d10000) + auVar121 + auVar122;
      local_228 = auVar122._0_8_;
      local_220 = (auVar122._8_8_ << 0xc | local_228 >> 0x34) + (auVar4._0_8_ & 0xffffffffffff);
      local_2e0.x.n[0] = (local_268._40_8_ + 0x3ffffbfffff0bc) - local_218.n[0];
      local_2e0.x.n[1] = (local_238 + 0x3ffffffffffffc) - local_218.n[1];
      local_2e0.x.n[2] = (local_230 + 0x3ffffffffffffc) - local_218.n[2];
      psVar141 = &local_2e0;
      local_228 = local_228 & 0xfffffffffffff;
      local_2e0.x.n[3] = (local_228 + 0x3ffffffffffffc) - local_218.n[3];
      local_2e0.x.n[4] = (local_220 + 0x3fffffffffffc) - local_218.n[4];
      iVar124 = secp256k1_fe_impl_normalizes_to_zero(&psVar141->x);
      if (iVar124 == 0) goto LAB_00168dde;
      psVar141 = &local_e0;
      psVar142 = &local_1e0;
      for (lVar136 = 0xb; lVar136 != 0; lVar136 = lVar136 + -1) {
        (psVar142->x).n[0] = (psVar141->x).n[0];
        psVar141 = (secp256k1_ge *)((long)psVar141 + ((ulong)bVar155 * -2 + 1) * 8);
        psVar142 = (secp256k1_ge *)((long)psVar142 + ((ulong)bVar155 * -2 + 1) * 8);
      }
      local_300 = local_300 + 0x40;
      if (local_300 == 0x80000) {
        return;
      }
    }
    psVar141 = (secp256k1_ge *)(local_268 + 0x28);
    iVar124 = secp256k1_fe_impl_normalizes_to_zero_var((secp256k1_fe *)psVar141);
    if (iVar124 == 0) goto LAB_001681d9;
LAB_00168de3:
    test_pre_g_table_cold_1();
LAB_00168de8:
    pre_g = a;
    test_pre_g_table_cold_2();
LAB_00168ded:
    test_pre_g_table_cold_3();
  }
  test_pre_g_table_cold_6();
  uVar2 = (pre_g->x).n[0];
  if ((((pre_g->x).n[1] == 0 && (pre_g->x).n[2] == 0) && (pre_g->x).n[3] == 0) && uVar2 == 0) {
    if ((int)(0x7f / (long)(int)extraout_EDX) < 0) {
      return;
    }
    memset(psVar141,0,(0x7f / (long)(int)extraout_EDX & 0xffffffffU) * 4 + 4);
    return;
  }
  uVar125 = (uint)uVar2;
  bVar155 = (byte)extraout_EDX;
  *(uint *)(psVar141->x).n = ((uVar125 << (-bVar155 & 0x1f)) >> (-bVar155 & 0x1f)) + (~uVar125 & 1);
  iVar124 = (int)(0x7f / (long)(int)extraout_EDX);
  if (iVar124 < 1) {
    return;
  }
  uVar137 = 0x7f / (long)(int)extraout_EDX & 0xffffffff;
  uVar125 = iVar124 * extraout_EDX;
  uVar145 = 0x80 - uVar125;
  uVar127 = uVar137 + 1;
  lVar136 = 0;
  while( true ) {
    uVar140 = extraout_EDX;
    if (lVar136 == 0) {
      uVar140 = uVar145;
    }
    uVar139 = (uVar140 + uVar125) - 1 >> 6;
    uVar153 = uVar125 >> 6;
    if (uVar139 == uVar153) {
      uVar139 = (uint)((pre_g->x).n[uVar139] >> ((byte)uVar125 & 0x3f));
    }
    else {
      bVar115 = (byte)uVar125 & 0x3f;
      uVar139 = (uint)((pre_g->x).n[uVar153] >> bVar115) |
                (uint)((pre_g->x).n[(ulong)uVar153 + 1] << 0x40 - bVar115);
    }
    if (uVar139 << (-(char)uVar140 & 0x1fU) != 0) break;
    *(undefined4 *)((long)(psVar141->x).n + uVar127 * 4 + -4) = 0;
    uVar127 = uVar127 - 1;
    uVar125 = uVar125 - extraout_EDX;
    lVar136 = lVar136 + 1;
    if ((long)uVar127 < 2) {
      return;
    }
  }
  if (uVar127 == 1 || (long)(uVar127 - 1) < 0) {
    return;
  }
  iVar124 = -1 << (bVar155 & 0x1f);
  uVar143 = 1;
  uVar125 = extraout_EDX;
  do {
    uVar140 = extraout_EDX;
    if (uVar137 == uVar143) {
      uVar140 = uVar145;
    }
    uVar153 = (uVar140 + uVar125) - 1 >> 6;
    uVar139 = uVar125 >> 6;
    if (uVar153 == uVar139) {
      uVar144 = (pre_g->x).n[uVar153] >> ((byte)uVar125 & 0x3f);
    }
    else {
      bVar115 = (byte)uVar125 & 0x3f;
      uVar144 = (pre_g->x).n[uVar139] >> bVar115 |
                (pre_g->x).n[(ulong)uVar139 + 1] << 0x40 - bVar115;
    }
    uVar140 = (uint)((int)uVar144 << (-(char)uVar140 & 0x1fU)) >> (-(char)uVar140 & 0x1fU);
    if ((uVar144 & 1) == 0) {
      piVar1 = (int *)((long)(psVar141->x).n + uVar143 * 4 + -4);
      *piVar1 = *piVar1 + iVar124;
      uVar140 = uVar140 | 1;
    }
    *(uint *)((long)(psVar141->x).n + uVar143 * 4) = uVar140;
    if (1 < uVar143) {
      iVar126 = *(int *)((long)(psVar141->x).n + uVar143 * 4 + -4);
      if (iVar126 == -1) {
        iVar126 = *(int *)((long)(psVar141->x).n + uVar143 * 4 + -8);
        if (0 < iVar126) {
          iVar126 = iVar126 + iVar124;
          goto LAB_00168fa6;
        }
      }
      else if ((iVar126 == 1) &&
              (iVar126 = *(int *)((long)(psVar141->x).n + uVar143 * 4 + -8), iVar126 < 0)) {
        iVar126 = iVar126 + (1 << (bVar155 & 0x1f));
LAB_00168fa6:
        *(int *)((long)(psVar141->x).n + uVar143 * 4 + -8) = iVar126;
        *(undefined4 *)((long)(psVar141->x).n + uVar143 * 4 + -4) = 0;
      }
    }
    uVar143 = uVar143 + 1;
    uVar125 = uVar125 + extraout_EDX;
    if ((uVar127 & 0xffffffff) == uVar143) {
      return;
    }
  } while( true );
}

Assistant:

static void test_pre_g_table(const secp256k1_ge_storage * pre_g, size_t n) {
    /* Tests the pre_g / pre_g_128 tables for consistency.
     * For independent verification we take a "geometric" approach to verification.
     * We check that every entry is on-curve.
     * We check that for consecutive entries p and q, that p + gg - q = 0 by checking
     *  (1) p, gg, and -q are colinear.
     *  (2) p, gg, and -q are all distinct.
     * where gg is twice the generator, where the generator is the first table entry.
     *
     * Checking the table's generators are correct is done in run_ecmult_pre_g.
     */
    secp256k1_gej g2;
    secp256k1_ge p, q, gg;
    secp256k1_fe dpx, dpy, dqx, dqy;
    size_t i;

    CHECK(0 < n);

    secp256k1_ge_from_storage(&p, &pre_g[0]);
    CHECK(secp256k1_ge_is_valid_var(&p));

    secp256k1_gej_set_ge(&g2, &p);
    secp256k1_gej_double_var(&g2, &g2, NULL);
    secp256k1_ge_set_gej_var(&gg, &g2);
    for (i = 1; i < n; ++i) {
        secp256k1_fe_negate(&dpx, &p.x, 1); secp256k1_fe_add(&dpx, &gg.x); secp256k1_fe_normalize_weak(&dpx);
        secp256k1_fe_negate(&dpy, &p.y, 1); secp256k1_fe_add(&dpy, &gg.y); secp256k1_fe_normalize_weak(&dpy);
        /* Check that p is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dpx) || !secp256k1_fe_normalizes_to_zero_var(&dpy));

        secp256k1_ge_from_storage(&q, &pre_g[i]);
        CHECK(secp256k1_ge_is_valid_var(&q));

        secp256k1_fe_negate(&dqx, &q.x, 1); secp256k1_fe_add(&dqx, &gg.x);
        dqy = q.y; secp256k1_fe_add(&dqy, &gg.y);
        /* Check that -q is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dqx) || !secp256k1_fe_normalizes_to_zero_var(&dqy));

        /* Check that -q is not equal to p */
        CHECK(!secp256k1_fe_equal(&dpx, &dqx) || !secp256k1_fe_equal(&dpy, &dqy));

        /* Check that p, -q and gg are colinear */
        secp256k1_fe_mul(&dpx, &dpx, &dqy);
        secp256k1_fe_mul(&dpy, &dpy, &dqx);
        CHECK(secp256k1_fe_equal(&dpx, &dpy));

        p = q;
    }
}